

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::
StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
::noteExpressionOrCopy
          (StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
           *this,Expression *expr,HeapType type,Index index,FieldInfo *info)

{
  uintptr_t uVar1;
  HeapType HVar2;
  Expression *pEVar3;
  Expression **ppEVar4;
  Expression *local_48;
  FieldInfo *local_40;
  Id local_34;
  
  HVar2.id = type.id;
  local_40 = info;
  local_34 = index;
  do {
    pEVar3 = (Expression *)HVar2.id;
    local_48 = pEVar3;
    ppEVar4 = Properties::getImmediateFallthroughPtr
                        (&local_48,
                         (PassOptions *)
                         &(this->
                          super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                          ).
                          super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                         ,(Module *)expr,AllowTeeBrIf);
    HVar2.id = (uintptr_t)*ppEVar4;
  } while (*ppEVar4 != pEVar3);
  if ((pEVar3->type).id == *(uintptr_t *)(type.id + 8)) {
    type.id = (uintptr_t)pEVar3;
  }
  if (((((Expression *)type.id)->_id == StructGetId) &&
      (((Expression *)(type.id + 0x10))->_id == local_34)) &&
     (uVar1 = (((Expression *)(type.id + 0x10))->type).id, *(long *)(uVar1 + 8) != 1)) {
    wasm::Type::getHeapType((Type *)(uVar1 + 8));
  }
  local_40->hasWrite = true;
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }